

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

OrphanBuilder *
capnp::_::OrphanBuilder::initStruct
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          StructSize size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  uint amount;
  AllocateResult AVar5;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  amount = ((uint)size & 0xffff) + ((uint)size >> 0x10);
  if (arena == (BuilderArena *)0x0) {
    if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) != 0 ||
        (int)(__return_storage_ptr__->tag).content != 0) {
      WireHelpers::zeroObject((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
    }
    if (amount == 0) {
      iVar3 = -4;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = __return_storage_ptr__;
      AVar5 = (AllocateResult)(auVar1 << 0x40);
    }
    else {
      if ((long)((_DAT_00000018 * 8 + _DAT_00000010) - _DAT_00000028) >> 3 < (long)(ulong)amount) {
        uVar4 = 0;
      }
      else {
        uVar4 = _DAT_00000028;
        _DAT_00000028 = _DAT_00000028 + (ulong)amount * 8;
      }
      iVar3 = ((uint)(uVar4 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 4;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar4;
      AVar5 = (AllocateResult)(auVar2 << 0x40);
    }
  }
  else {
    AVar5 = BuilderArena::allocate(arena,amount);
    iVar3 = -4;
  }
  *(int *)&(__return_storage_ptr__->tag).content = iVar3;
  *(StructDataWordCount *)((long)&(__return_storage_ptr__->tag).content + 4) = size.data;
  *(StructPointerCount *)((long)&(__return_storage_ptr__->tag).content + 6) = size.pointers;
  __return_storage_ptr__->segment = AVar5.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->location = AVar5.words;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initStruct(
    BuilderArena* arena, CapTableBuilder* capTable, StructSize size) {
  OrphanBuilder result;
  StructBuilder builder = WireHelpers::initStructPointer(
      result.tagAsPtr(), nullptr, capTable, size, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}